

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
Omega_h::any_cast<std::__cxx11::string&&>(any *operand)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bad_any_cast *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  any *operand_local;
  
  pbVar1 = any_cast<std::__cxx11::string>(operand);
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  pbVar1 = detail::any_cast_move_if_true<std::__cxx11::string&&>(pbVar1);
  return pbVar1;
}

Assistant:

inline ValueType any_cast(any&& operand) {
  // https://cplusplus.github.io/LWG/lwg-active.html#2509
  using can_move = std::integral_constant<bool,
      std::is_move_constructible<ValueType>::value &&
          !std::is_lvalue_reference<ValueType>::value>;

  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return detail::any_cast_move_if_true<ValueType>(p, can_move());
}